

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::tessellation::anon_unknown_0::InvariantOuterEdge::OuterEdgeIndexIndependenceTestInstance::
iterate(TestStatus *__return_storage_ptr__,OuterEdgeIndexIndependenceTestInstance *this)

{
  Winding winding;
  bool bVar1;
  size_type sVar2;
  TestContext *pTVar3;
  TestLog *log_00;
  const_reference pvVar4;
  MessageBuilder *pMVar5;
  const_reference pvVar6;
  int numIndentationSpaces;
  ulong uVar7;
  pair<std::_Rb_tree_const_iterator<tcu::Vector<float,_3>_>,_bool> pVar8;
  TestLog *local_620;
  TestLog *local_618;
  TestLog *local_610;
  TestLog *local_608;
  TestLog *local_600;
  float local_5e4;
  float local_5dc;
  float local_5d4;
  float local_5cc;
  allocator<char> local_579;
  string local_578;
  allocator<char> local_551;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  MessageBuilder local_4b0;
  string local_330;
  string local_310;
  MessageBuilder local_2f0;
  TestLog *local_170;
  TestLog *log;
  char *swizzleDesc;
  undefined1 local_158;
  Vector<float,_3> local_14c;
  _Base_ptr local_140;
  undefined1 local_138;
  Vector<float,_3> local_130;
  undefined1 local_124 [20];
  Vec3 *coord;
  int i;
  int primitiveNdx;
  Vec3Set currentEdgeVertices;
  string local_d0;
  undefined1 local_b0 [8];
  DrawResult result;
  undefined1 local_78 [8];
  vector<float,_std::allocator<float>_> patchTessLevels;
  OuterEdgeDescription *edgeDesc;
  undefined1 local_50 [4];
  int outerEdgeIndex;
  Vec3Set firstEdgeVertices;
  int outerEdgeLevelCaseNdx;
  OuterEdgeIndexIndependenceTestInstance *this_local;
  
  firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  do {
    if (0xb < firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"OK",&local_579);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_578);
      std::__cxx11::string::~string((string *)&local_578);
      std::allocator<char>::~allocator(&local_579);
      return __return_storage_ptr__;
    }
    std::
    set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
    ::set((set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
           *)local_50);
    for (edgeDesc._4_4_ = 0;
        sVar2 = std::
                vector<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                ::size(&(this->super_BaseTestInstance).m_edgeDescriptions),
        edgeDesc._4_4_ < (int)sVar2; edgeDesc._4_4_ = edgeDesc._4_4_ + 1) {
      patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    vector<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                    ::operator[](&(this->super_BaseTestInstance).m_edgeDescriptions,
                                 (long)edgeDesc._4_4_);
      generatePatchTessLevels
                ((vector<float,_std::allocator<float>_> *)local_78,
                 (this->super_BaseTestInstance).m_numPatchesToDraw,edgeDesc._4_4_,
                 *(float *)(tessellation::(anonymous_namespace)::InvariantOuterEdge::
                            BaseTestInstance::m_singleOuterEdgeLevels +
                           (long)firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                 _4_4_ * 4));
      BaseTestInstance::uploadVertexAttributes
                (&this->super_BaseTestInstance,(vector<float,_std::allocator<float>_> *)local_78);
      pTVar3 = Context::getTestContext((this->super_BaseTestInstance).super_TestInstance.m_context);
      log_00 = tcu::TestContext::getLog(pTVar3);
      logOuterTessellationLevel
                (log_00,*(float *)(tessellation::(anonymous_namespace)::InvariantOuterEdge::
                                   BaseTestInstance::m_singleOuterEdgeLevels +
                                  (long)firstEdgeVertices._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count._4_4_ * 4),
                 (OuterEdgeDescription *)
                 patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      sVar2 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)local_78);
      winding = (this->super_BaseTestInstance).m_caseDef.winding;
      uVar7 = (ulong)winding;
      BaseTestInstance::draw
                ((DrawResult *)local_b0,&this->super_BaseTestInstance,(deUint32)sVar2,
                 (vector<float,_std::allocator<float>_> *)local_78,winding,
                 (bool)((this->super_BaseTestInstance).m_caseDef.usePointMode & 1));
      if ((local_b0[0] & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"Invalid set of vertices",
                   (allocator<char> *)
                   ((long)&currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
                  );
        tcu::TestStatus::fail(__return_storage_ptr__,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
                  );
        currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
      }
      else {
        std::
        set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ::set((set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
               *)&i);
        for (coord._4_4_ = 0; numIndentationSpaces = (int)uVar7,
            coord._4_4_ < result.refNumPrimitives; coord._4_4_ = coord._4_4_ + 1) {
          for (coord._0_4_ = 0; (int)coord < (int)result._0_4_; coord._0_4_ = (int)coord + 1) {
            pvVar4 = std::
                     vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                     ::operator[]((vector<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                                   *)&result.numPrimitiveVertices,(long)coord._4_4_);
            uVar7 = 2;
            tcu::Vector<float,_4>::swizzle
                      ((Vector<float,_4> *)local_124,(int)pvVar4 + 0x10 + (int)coord * 0x10,0,1);
            local_124._12_8_ = local_124;
            bVar1 = OuterEdgeDescription::contains
                              ((OuterEdgeDescription *)
                               patchTessLevels.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (Vec3 *)local_124._12_8_);
            if (bVar1) {
              if ((this->super_BaseTestInstance).m_caseDef.primitiveType ==
                  TESSPRIMITIVETYPE_TRIANGLES) {
                if (edgeDesc._4_4_ == 0) {
                  tcu::Vector<float,_3>::Vector(&local_130,(Vector<float,_3> *)local_124._12_8_);
                }
                else if (edgeDesc._4_4_ == 1) {
                  uVar7 = 2;
                  tcu::Vector<float,_3>::swizzle(&local_130,(int)local_124._12_8_,1,0);
                }
                else if (edgeDesc._4_4_ == 2) {
                  uVar7 = 0;
                  tcu::Vector<float,_3>::swizzle(&local_130,(int)local_124._12_8_,2,1);
                }
                else {
                  tcu::Vector<float,_3>::Vector(&local_130,-1.0);
                }
                pVar8 = std::
                        set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ::insert((set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                  *)&i,&local_130);
                local_140 = (_Base_ptr)pVar8.first._M_node;
                local_138 = pVar8.second;
              }
              else if ((this->super_BaseTestInstance).m_caseDef.primitiveType ==
                       TESSPRIMITIVETYPE_QUADS) {
                if (edgeDesc._4_4_ == 0) {
                  local_5cc = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_124._12_8_);
                }
                else {
                  if (edgeDesc._4_4_ == 1) {
                    local_5d4 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_124._12_8_);
                  }
                  else {
                    if (edgeDesc._4_4_ == 2) {
                      local_5dc = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_124._12_8_);
                    }
                    else {
                      if (edgeDesc._4_4_ == 3) {
                        local_5e4 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_124._12_8_);
                      }
                      else {
                        local_5e4 = -1.0;
                      }
                      local_5dc = local_5e4;
                    }
                    local_5d4 = local_5dc;
                  }
                  local_5cc = local_5d4;
                }
                tcu::Vector<float,_3>::Vector(&local_14c,local_5cc,0.0,0.0);
                pVar8 = std::
                        set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ::insert((set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                  *)&i,&local_14c);
                swizzleDesc = (char *)pVar8.first._M_node;
                local_158 = pVar8.second;
              }
            }
          }
        }
        if (edgeDesc._4_4_ == 0) {
          std::
          set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
          ::operator=((set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       *)local_50,
                      (set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       *)&i);
LAB_00de525c:
          currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
        }
        else {
          bVar1 = std::operator!=((set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                   *)&i,(set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                         *)local_50);
          if (!bVar1) goto LAB_00de525c;
          if ((this->super_BaseTestInstance).m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
          {
            if (edgeDesc._4_4_ == 1) {
              local_600 = (TestLog *)0x133e1f5;
            }
            else {
              local_600 = (TestLog *)0x0;
              if (edgeDesc._4_4_ == 2) {
                local_600 = (TestLog *)0x133e1ff;
              }
            }
            local_608 = local_600;
          }
          else {
            if ((this->super_BaseTestInstance).m_caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS) {
              if (edgeDesc._4_4_ == 1) {
                local_610 = (TestLog *)0x133e209;
              }
              else {
                if (edgeDesc._4_4_ == 2) {
                  local_618 = (TestLog *)0x133e210;
                }
                else {
                  local_618 = (TestLog *)0x0;
                  if (edgeDesc._4_4_ == 3) {
                    local_618 = (TestLog *)0x133e209;
                  }
                }
                local_610 = local_618;
              }
              local_620 = local_610;
            }
            else {
              local_620 = (TestLog *)0x0;
            }
            local_608 = local_620;
          }
          log = local_608;
          pTVar3 = Context::getTestContext
                             ((this->super_BaseTestInstance).super_TestInstance.m_context);
          local_170 = tcu::TestContext::getLog(pTVar3);
          tcu::TestLog::operator<<(&local_2f0,local_170,(BeginMessageToken *)&tcu::TestLog::Message)
          ;
          pMVar5 = tcu::MessageBuilder::operator<<
                             (&local_2f0,(char (*) [37])"Failure: the set of vertices on the ");
          tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                    (&local_310,
                     patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_310);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [6])" edge");
          pMVar5 = tcu::MessageBuilder::operator<<
                             (pMVar5,(char (*) [43])" doesn\'t match the set of vertices on the ");
          pvVar6 = std::
                   vector<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                   ::operator[](&(this->super_BaseTestInstance).m_edgeDescriptions,0);
          tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                    (&local_330,pvVar6);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_330);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [6])" edge");
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_330);
          std::__cxx11::string::~string((string *)&local_310);
          tcu::MessageBuilder::~MessageBuilder(&local_2f0);
          tcu::TestLog::operator<<(&local_4b0,local_170,(BeginMessageToken *)&tcu::TestLog::Message)
          ;
          pMVar5 = tcu::MessageBuilder::operator<<
                             (&local_4b0,(char (*) [26])"Note: set of vertices on ");
          tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                    (&local_4d0,
                     patchTessLevels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_4d0);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (pMVar5,(char (*) [33])" edge, components swizzled like ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char **)&log);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (pMVar5,(char (*) [42])" to match component order on first edge:\n");
          containerStr<std::set<tcu::Vector<float,3>,vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                    (&local_4f0,(tessellation *)&i,
                     (set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)0x5,0,numIndentationSpaces);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_4f0);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [5])"\non ");
          pvVar6 = std::
                   vector<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                   ::operator[](&(this->super_BaseTestInstance).m_edgeDescriptions,0);
          tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                    (&local_510,pvVar6);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_510);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [8])0x133e2ca);
          containerStr<std::set<tcu::Vector<float,3>,vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,std::allocator<tcu::Vector<float,3>>>>
                    (&local_530,(tessellation *)local_50,
                     (set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)0x5,0,numIndentationSpaces);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_530);
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_530);
          std::__cxx11::string::~string((string *)&local_510);
          std::__cxx11::string::~string((string *)&local_4f0);
          std::__cxx11::string::~string((string *)&local_4d0);
          tcu::MessageBuilder::~MessageBuilder(&local_4b0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_550,"Invalid set of vertices",&local_551);
          tcu::TestStatus::fail(__return_storage_ptr__,&local_550);
          std::__cxx11::string::~string((string *)&local_550);
          std::allocator<char>::~allocator(&local_551);
          currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
        }
        std::
        set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ::~set((set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                *)&i);
      }
      BaseTestInstance::DrawResult::~DrawResult((DrawResult *)local_b0);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_78);
      if ((int)currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
      goto LAB_00de52d0;
    }
    currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
LAB_00de52d0:
    std::
    set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
    ::~set((set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
            *)local_50);
    if ((int)currentEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      return __return_storage_ptr__;
    }
    firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
         firstEdgeVertices._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1;
  } while( true );
}

Assistant:

tcu::TestStatus OuterEdgeIndexIndependenceTestInstance::iterate (void)
{
	for (int outerEdgeLevelCaseNdx = 0; outerEdgeLevelCaseNdx < DE_LENGTH_OF_ARRAY(m_singleOuterEdgeLevels); ++outerEdgeLevelCaseNdx)
	{
		Vec3Set firstEdgeVertices;

		for (int outerEdgeIndex = 0; outerEdgeIndex < static_cast<int>(m_edgeDescriptions.size()); ++outerEdgeIndex)
		{
			const OuterEdgeDescription& edgeDesc        = m_edgeDescriptions[outerEdgeIndex];
			const std::vector<float>    patchTessLevels = generatePatchTessLevels(m_numPatchesToDraw, outerEdgeIndex, m_singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);

			uploadVertexAttributes(patchTessLevels);
			logOuterTessellationLevel(m_context.getTestContext().getLog(), m_singleOuterEdgeLevels[outerEdgeLevelCaseNdx], edgeDesc);
			const DrawResult result = draw(static_cast<deUint32>(patchTessLevels.size()), patchTessLevels, m_caseDef.winding, m_caseDef.usePointMode);

			// Verify case result

			if (!result.success)
				return tcu::TestStatus::fail("Invalid set of vertices");

			Vec3Set currentEdgeVertices;

			// Get the vertices on the current outer edge.
			for (int primitiveNdx = 0; primitiveNdx < result.numPrimitives; ++primitiveNdx)
			for (int i = 0; i < result.numPrimitiveVertices; ++i)
			{
				const tcu::Vec3& coord = result.primitives[primitiveNdx].tessCoord[i].swizzle(0, 1, 2);
				if (edgeDesc.contains(coord))
				{
					// Swizzle components to match the order of the first edge.
					if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
						currentEdgeVertices.insert(outerEdgeIndex == 0 ? coord :
												   outerEdgeIndex == 1 ? coord.swizzle(1, 0, 2) :
												   outerEdgeIndex == 2 ? coord.swizzle(2, 1, 0) : tcu::Vec3(-1.0f));
					else if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS)
						currentEdgeVertices.insert(tcu::Vec3(outerEdgeIndex == 0 ? coord.y() :
															 outerEdgeIndex == 1 ? coord.x() :
															 outerEdgeIndex == 2 ? coord.y() :
															 outerEdgeIndex == 3 ? coord.x() : -1.0f,
															 0.0f, 0.0f));
					else
						DE_ASSERT(false);
				}
			}

			if (outerEdgeIndex == 0)
				firstEdgeVertices = currentEdgeVertices;
			else
			{
				// Compare vertices of this edge to those of the first edge.
				if (currentEdgeVertices != firstEdgeVertices)
				{
					const char* const swizzleDesc =
						m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? (outerEdgeIndex == 1 ? "(y, x, z)" :
																				  outerEdgeIndex == 2 ? "(z, y, x)" : DE_NULL) :
						m_caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS ? (outerEdgeIndex == 1 ? "(x, 0)" :
																			  outerEdgeIndex == 2 ? "(y, 0)" :
																			  outerEdgeIndex == 3 ? "(x, 0)" : DE_NULL)
						: DE_NULL;

					tcu::TestLog& log = m_context.getTestContext().getLog();
					log << tcu::TestLog::Message
						<< "Failure: the set of vertices on the " << edgeDesc.description() << " edge"
						<< " doesn't match the set of vertices on the " << m_edgeDescriptions[0].description() << " edge"
						<< tcu::TestLog::EndMessage;

					log << tcu::TestLog::Message
						<< "Note: set of vertices on " << edgeDesc.description() << " edge, components swizzled like " << swizzleDesc
						<< " to match component order on first edge:\n" << containerStr(currentEdgeVertices, 5)
						<< "\non " << m_edgeDescriptions[0].description() << " edge:\n" << containerStr(firstEdgeVertices, 5)
						<< tcu::TestLog::EndMessage;

					return tcu::TestStatus::fail("Invalid set of vertices");
				}
			}
		}
	}
	return tcu::TestStatus::pass("OK");
}